

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O2

void load_kde_icons(char *directory,char *icondir)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  dirent **entries;
  char full [2048];
  dirent **local_840;
  char local_838 [2056];
  
  local_840 = (dirent **)0x0;
  uVar1 = fl_filename_list(directory,&local_840,fl_numericsort);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (local_840[uVar3]->d_name[0] != '.') {
      snprintf(local_838,0x800,"%s/%s",directory,local_840[uVar3]->d_name);
      iVar2 = fl_filename_isdir(local_838);
      if (iVar2 == 0) {
        load_kde_mimelnk(local_838,icondir);
      }
      else {
        load_kde_icons(local_838,icondir);
      }
    }
    free(local_840[uVar3]);
  }
  free(local_840);
  return;
}

Assistant:

static void
load_kde_icons(const char *directory,	// I - Directory to load
               const char *icondir) {	// I - Location of icons
  int		i;			// Looping var
  int		n;			// Number of entries in directory
  dirent	**entries;		// Entries in directory
  char		full[FL_PATH_MAX];	// Full name of file


  entries = (dirent **)0;
  n       = fl_filename_list(directory, &entries);

  for (i = 0; i < n; i ++) {
    if (entries[i]->d_name[0] != '.') {
      snprintf(full, sizeof(full), "%s/%s", directory, entries[i]->d_name);

      if (fl_filename_isdir(full)) load_kde_icons(full, icondir);
      else load_kde_mimelnk(full, icondir);
    }

    free((void *)entries[i]);
  }

  free((void*)entries);
}